

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_good_speed_feature_framesize_dependent(AV1_COMP *cpi,SPEED_FEATURES *sf,int speed)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  bool bVar10;
  int rate_tolerance;
  RateControlCfg *rc_cfg;
  int allow_screen_content_tools;
  int is_lf_frame;
  int is_boosted_arf2_bwd_type;
  int boosted;
  _Bool use_hbd;
  int is_4k_or_larger;
  int is_1080p_or_larger;
  int is_720p_or_larger;
  int is_480p_or_larger;
  int is_480p_or_lesser;
  AV1_COMMON *cm;
  int local_70;
  bool local_69;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  undefined8 in_stack_ffffffffffffffb0;
  int speed_00;
  
  speed_00 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
    local_58 = (int)in_RDI[0x77f7];
  }
  else {
    local_58 = *(int *)((long)in_RDI + 0x3bfbc);
  }
  bVar10 = local_58 < 0x1e1;
  if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
    local_5c = (int)in_RDI[0x77f7];
  }
  else {
    local_5c = *(int *)((long)in_RDI + 0x3bfbc);
  }
  bVar1 = 0x1df < local_5c;
  if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
    local_60 = (int)in_RDI[0x77f7];
  }
  else {
    local_60 = *(int *)((long)in_RDI + 0x3bfbc);
  }
  bVar2 = 0x2cf < local_60;
  if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
    local_64 = (int)in_RDI[0x77f7];
  }
  else {
    local_64 = *(int *)((long)in_RDI + 0x3bfbc);
  }
  if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
    local_68 = (int)in_RDI[0x77f7];
  }
  else {
    local_68 = *(int *)((long)in_RDI + 0x3bfbc);
  }
  bVar3 = *(byte *)((long)in_RDI + 0x42773) & 1;
  iVar4 = frame_is_boosted((AV1_COMP *)0x2f7fd2);
  local_69 = true;
  if (iVar4 == 0) {
    local_69 = *(char *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258)) == '\x06';
  }
  uVar5 = (uint)local_69;
  uVar6 = (uint)(*(char *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258)) == '\x01');
  uVar7 = (uint)(*(byte *)((long)in_RDI + 0x3c16f) & 1);
  if (bVar1) {
    *(undefined1 *)(in_RSI + 0xa8) = 0xf;
    if (bVar2) {
      *(undefined1 *)(in_RSI + 0xa9) = 3;
    }
    else {
      *(undefined1 *)(in_RSI + 0xa9) = 2;
    }
  }
  else {
    *(undefined1 *)(in_RSI + 0xa8) = 0xc;
    *(undefined1 *)(in_RSI + 0xa9) = 1;
    if (bVar3 != 0) {
      *(undefined4 *)(in_RSI + 0x350) = 1;
    }
  }
  if (0x86f < local_68) {
    *(undefined1 *)(in_RSI + 0xaa) = 3;
  }
  if (bVar2) {
    *(undefined4 *)(in_RSI + 0x19c) = 2;
  }
  else {
    *(undefined4 *)(in_RSI + 0xbc) = 200;
    *(undefined4 *)(in_RSI + 0xc0) = 0xfa;
    *(undefined4 *)(in_RSI + 0xc4) = 300;
    *(undefined4 *)(in_RSI + 200) = 500;
    *(undefined4 *)(in_RSI + 0xcc) = 0xffffffff;
    *(undefined4 *)(in_RSI + 0xa0) = 1;
    speed_00 = (int)((ulong)(in_RDI + 0x8472) >> 0x20);
    if ((int)in_RDI[0x8479] < *(int *)((long)in_RDI + 0x423cc)) {
      local_70 = (int)in_RDI[0x8479];
    }
    else {
      local_70 = *(int *)((long)in_RDI + 0x423cc);
    }
    *(int *)(in_RSI + 8) = (local_70 >> 2) + 0x19;
  }
  if (0 < in_EDX) {
    if (bVar10) {
      *(undefined4 *)(in_RSI + 0x1e4) = 1;
    }
    if (bVar2) {
      *(undefined1 *)(in_RSI + 0xa8) = 0xf;
    }
    else if (bVar1) {
      *(undefined1 *)(in_RSI + 0xa8) = 0xc;
    }
    else {
      *(undefined1 *)(in_RSI + 0xa8) = 9;
    }
    if (!bVar2) {
      *(undefined4 *)(in_RSI + 0xbc) = 200;
      *(undefined4 *)(in_RSI + 0xc0) = 0xfa;
      *(undefined4 *)(in_RSI + 0xc4) = 300;
      *(undefined4 *)(in_RSI + 200) = 300;
      *(undefined4 *)(in_RSI + 0xcc) = 0xffffffff;
    }
    *(undefined4 *)(in_RSI + 0xa0) = 2;
    *(undefined4 *)(in_RSI + 0x3a4) = 1;
  }
  if (1 < in_EDX) {
    if (bVar2) {
      *(undefined1 *)(in_RSI + 0xa8) = 0xc;
    }
    else if (bVar1) {
      *(undefined1 *)(in_RSI + 0xa8) = 9;
    }
    else {
      *(undefined1 *)(in_RSI + 0xa8) = 9;
    }
    if (bVar2) {
      *(undefined8 *)(in_RSI + 0xb0) = 0x1000000;
      *(undefined4 *)(in_RSI + 0xb8) = 0x78;
      *(undefined4 *)(in_RSI + 0x220) = 0x10;
    }
    else {
      *(undefined8 *)(in_RSI + 0xb0) = 0x400000;
      *(undefined4 *)(in_RSI + 0xb8) = 100;
      *(undefined4 *)(in_RSI + 0x220) = 8;
    }
    if (bVar1) {
      *(undefined4 *)(in_RSI + 0x228) = 100;
    }
    else {
      *(undefined4 *)(in_RSI + 0x228) = 0xffffffff;
    }
    if (bVar10) {
      *(undefined4 *)(in_RSI + 0x20c) = 1;
    }
    if (bVar2) {
      *(uint *)(in_RSI + 0x270) = (uint)(uVar6 != 0);
    }
    else {
      uVar9 = 0;
      if (uVar6 != 0) {
        uVar9 = 2;
      }
      *(undefined4 *)(in_RSI + 0x270) = uVar9;
    }
    if (bVar1) {
      *(undefined4 *)(in_RSI + 0x334) = 1;
      if (bVar3 != 0) {
        *(undefined4 *)(in_RSI + 0x350) = 2;
      }
    }
    else {
      if (bVar3 != 0) {
        *(undefined4 *)(in_RSI + 0x350) = 3;
      }
      *(uint *)(in_RSI + 0x33c) = (uint)(iVar4 == 0);
      *(uint *)(in_RSI + 0x374) = (uint)(iVar4 == 0);
    }
    if (bVar2) {
      uVar9 = 2;
      if (iVar4 != 0) {
        uVar9 = 0;
      }
      *(undefined4 *)(in_RSI + 0x1a4) = uVar9;
      *(undefined4 *)(in_RSI + 0x130) = 1;
    }
    else {
      *(undefined4 *)(in_RSI + 0x1a4) = 1;
      *(undefined4 *)(in_RSI + 0x130) = 2;
    }
    if (!bVar2) {
      *(undefined4 *)(in_RSI + 8) = 0x32;
      *(uint *)(in_RSI + 0x238) = (uint)(uVar5 == 0);
      *(undefined4 *)(in_RSI + 0x268) = 1;
    }
  }
  if (2 < in_EDX) {
    *(undefined4 *)(in_RSI + 0x268) = 1;
    *(undefined4 *)(in_RSI + 0x1e4) = 2;
    *(undefined4 *)(in_RSI + 0x20c) = 1;
    uVar9 = 0;
    if (uVar6 != 0) {
      uVar9 = 3;
    }
    *(undefined4 *)(in_RSI + 0x270) = uVar9;
    *(uint *)(in_RSI + 0x238) = (uint)(iVar4 == 0);
    *(undefined4 *)(in_RSI + 0x33c) = 1;
    iVar8 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
    *(uint *)(in_RSI + 0x374) = (uint)(iVar8 == 0);
    *(undefined4 *)(in_RSI + 0xa0) = 0;
    if (bVar2) {
      *(undefined8 *)(in_RSI + 0xb0) = 0x2000000;
      *(undefined4 *)(in_RSI + 0xb8) = 200;
      uVar9 = 0;
      if (uVar6 != 0) {
        uVar9 = 2;
      }
      *(undefined4 *)(in_RSI + 0x120) = uVar9;
    }
    else {
      *(undefined1 *)(in_RSI + 0xe4) = 9;
      *(undefined8 *)(in_RSI + 0xb0) = 0x800000;
      *(undefined4 *)(in_RSI + 0xb8) = 0x78;
      *(uint *)(in_RSI + 0x120) = (uint)(uVar6 != 0);
    }
    if (bVar3 != 0) {
      *(undefined4 *)(in_RSI + 0x350) = 3;
    }
    if (bVar1) {
      *(undefined4 *)(in_RSI + 0x104) = 1;
    }
    else {
      *(undefined4 *)(in_RSI + 0x104) = 0;
    }
    if (bVar2) {
      uVar9 = 2;
      if (iVar4 != 0) {
        uVar9 = 1;
      }
      *(undefined4 *)(in_RSI + 0x2c4) = uVar9;
    }
    else {
      uVar9 = 3;
      if (iVar4 != 0) {
        uVar9 = 1;
      }
      *(undefined4 *)(in_RSI + 0x2c4) = uVar9;
    }
    if (bVar2) {
      *(undefined4 *)(in_RSI + 0x22c) = 100;
      *(uint *)(in_RSI + 0x274) = (uint)(iVar4 == 0);
    }
    else {
      *(undefined4 *)(in_RSI + 0x22c) = 0xffffffff;
      uVar9 = 2;
      if (iVar4 != 0) {
        uVar9 = 0;
      }
      *(undefined4 *)(in_RSI + 0x274) = uVar9;
      *(undefined4 *)(in_RSI + 0x3a4) = 2;
    }
    *(undefined4 *)(in_RSI + 0x228) = 0xffffffff;
  }
  if (3 < in_EDX) {
    *(undefined4 *)(in_RSI + 0x33c) = 2;
    *(undefined4 *)(in_RSI + 0x374) = 1;
    if (bVar2) {
      *(undefined8 *)(in_RSI + 0xb0) = 0x4000000;
    }
    else {
      *(undefined8 *)(in_RSI + 0xb0) = 0x1000000;
    }
    *(undefined4 *)(in_RSI + 0x104) = 1;
    if (bVar1) {
      *(undefined4 *)(in_RSI + 0x334) = 2;
    }
    else {
      *(uint *)(in_RSI + 0x1a8) = (uint)(iVar4 == 0);
    }
    *(undefined4 *)(in_RSI + 0x22c) = 0xffffffff;
    *(undefined4 *)(in_RSI + 0x220) = 0x7fffffff;
    uVar9 = 2;
    if (iVar4 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x274) = uVar9;
    if (bVar10) {
      *(undefined4 *)(in_RSI + 0x1e4) = 3;
    }
    if (bVar2) {
      *(undefined4 *)(in_RSI + 0x1e0) = 1;
    }
    else if (bVar1) {
      *(uint *)(in_RSI + 0x1e0) = (uint)(uVar5 == 0);
    }
    if (bVar2) {
      *(undefined4 *)(in_RSI + 8) = 0x20;
    }
    else {
      *(undefined4 *)(in_RSI + 8) = 0x37;
    }
    *(undefined4 *)(in_RSI + 0x2c4) = 4;
    *(undefined4 *)(in_RSI + 0x3a4) = 3;
  }
  if (4 < in_EDX) {
    if (bVar2) {
      *(undefined4 *)(in_RSI + 0x224) = 0x10;
    }
    else if (bVar1) {
      *(undefined4 *)(in_RSI + 0x224) = 8;
    }
    if (bVar2) {
      *(undefined4 *)(in_RSI + 8) = 0x28;
    }
    *(undefined4 *)(in_RSI + 0x1e4) = 4;
    *(undefined4 *)(in_RSI + 0x1e0) = 1;
    *(uint *)(in_RSI + 0x1a8) = (uint)(iVar4 == 0);
    if (!bVar2) {
      *(undefined4 *)(in_RSI + 0x240) = 2;
      *(uint *)(in_RSI + 0x214) = (uint)(iVar4 == 0 && uVar7 == 0);
      *(undefined4 *)(in_RSI + 0x19c) = 1;
    }
    if (!bVar1) {
      *(undefined8 *)(in_RSI + 0xb0) = 0x4000000;
    }
    if (bVar10) {
      *(undefined1 *)(in_RSI + 0x250) = 1;
    }
    else {
      *(undefined1 *)(in_RSI + 0x250) = 2;
    }
    if (bVar2) {
      bVar10 = true;
      if (uVar7 == 0) {
        iVar8 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
        bVar10 = iVar8 != 0;
      }
      *(uint *)(in_RSI + 0xf0) = (uint)!bVar10;
    }
    if (bVar1) {
      *(undefined4 *)(in_RSI + 0x6c) = 1;
    }
  }
  if (5 < in_EDX) {
    *(undefined4 *)(in_RSI + 0x33c) = 4;
    *(undefined1 *)(in_RSI + 0x250) = 3;
    *(undefined4 *)(in_RSI + 0x1e0) = 2;
    *(uint *)(in_RSI + 0x214) = (uint)(iVar4 == 0 && uVar7 == 0);
    uVar9 = 2;
    if (iVar4 != 0) {
      uVar9 = 0;
    }
    *(undefined4 *)(in_RSI + 0x1a8) = uVar9;
    if (bVar2) {
      *(undefined1 *)(in_RSI + 0xa9) = 0;
    }
    else if (bVar1) {
      *(undefined1 *)(in_RSI + 0xa9) = 1;
    }
    if (bVar1) {
      *(undefined4 *)(in_RSI + 0x2c) = 1;
    }
    if (0x437 < local_64) {
      *(undefined1 *)(in_RSI + 0xaa) = 3;
    }
    if (bVar2) {
      *(undefined4 *)(in_RSI + 0x25c) = 1;
      *(undefined1 *)(in_RSI + 0xa8) = 9;
      *(undefined8 *)(in_RSI + 0xb0) = 0x10000000;
      *(undefined4 *)(in_RSI + 0x218) = 2;
    }
    else {
      *(undefined4 *)(in_RSI + 0x244) = 3;
      *(undefined4 *)(in_RSI + 0x248) = 3;
      *(undefined1 *)(in_RSI + 0xa8) = 6;
      *(undefined8 *)(in_RSI + 0xb0) = 0x4000000;
      *(undefined4 *)(in_RSI + 0x218) = 1;
      uVar9 = 0x96;
      if (uVar5 != 0) {
        uVar9 = 0x1c2;
      }
      *(undefined4 *)(in_RSI + 800) = uVar9;
    }
    *(undefined4 *)(in_RSI + 0x3a4) = 4;
    *(undefined4 *)(in_RSI + 8) = 0x37;
  }
  if ((int)in_RDI[0x84e6] != 0) {
    set_good_speed_features_lc_dec_framesize_dependent
              ((AV1_COMP *)CONCAT44(iVar4,uVar5),(SPEED_FEATURES *)CONCAT44(uVar6,uVar7),speed_00);
  }
  return;
}

Assistant:

static void set_good_speed_feature_framesize_dependent(
    const AV1_COMP *const cpi, SPEED_FEATURES *const sf, int speed) {
  const AV1_COMMON *const cm = &cpi->common;
  const int is_480p_or_lesser = AOMMIN(cm->width, cm->height) <= 480;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_1080p_or_larger = AOMMIN(cm->width, cm->height) >= 1080;
  const int is_4k_or_larger = AOMMIN(cm->width, cm->height) >= 2160;
  const bool use_hbd = cpi->oxcf.use_highbitdepth;
  // Speed features applicable for temporal filtering and tpl modules may be
  // changed based on frame type at places where the sf is applied (Example :
  // use_downsampled_sad). This is because temporal filtering and tpl modules
  // are called before this function (except for the first key frame).
  // TODO(deepa.kg@ittiam.com): For the speed features applicable to temporal
  // filtering and tpl modules, modify the sf initialization appropriately
  // before calling the modules.
  const int boosted = frame_is_boosted(cpi);
  const int is_boosted_arf2_bwd_type =
      boosted ||
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE;
  const int is_lf_frame =
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index] == LF_UPDATE;
  const int allow_screen_content_tools =
      cm->features.allow_screen_content_tools;

  if (is_480p_or_larger) {
    sf->part_sf.use_square_partition_only_threshold = BLOCK_128X128;
    if (is_720p_or_larger)
      sf->part_sf.auto_max_partition_based_on_simple_motion = ADAPT_PRED;
    else
      sf->part_sf.auto_max_partition_based_on_simple_motion = RELAXED_PRED;
  } else {
    sf->part_sf.use_square_partition_only_threshold = BLOCK_64X64;
    sf->part_sf.auto_max_partition_based_on_simple_motion = DIRECT_PRED;
    if (use_hbd) sf->tx_sf.prune_tx_size_level = 1;
  }

  if (is_4k_or_larger) {
    sf->part_sf.default_min_partition_size = BLOCK_8X8;
  }

  // TODO(huisu@google.com): train models for 720P and above.
  if (!is_720p_or_larger) {
    sf->part_sf.ml_partition_search_breakout_thresh[0] = 200;  // BLOCK_8X8
    sf->part_sf.ml_partition_search_breakout_thresh[1] = 250;  // BLOCK_16X16
    sf->part_sf.ml_partition_search_breakout_thresh[2] = 300;  // BLOCK_32X32
    sf->part_sf.ml_partition_search_breakout_thresh[3] = 500;  // BLOCK_64X64
    sf->part_sf.ml_partition_search_breakout_thresh[4] = -1;   // BLOCK_128X128
    sf->part_sf.ml_early_term_after_part_split_level = 1;
  }

  if (is_720p_or_larger) {
    // TODO(chiyotsai@google.com): make this speed feature adaptive based on
    // current block's vertical texture instead of hardcoded with resolution
    sf->mv_sf.use_downsampled_sad = 2;
  }

  if (!is_720p_or_larger) {
    const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;
    const int rate_tolerance =
        AOMMIN(rc_cfg->under_shoot_pct, rc_cfg->over_shoot_pct);
    sf->hl_sf.recode_tolerance = 25 + (rate_tolerance >> 2);
  }

  if (speed >= 1) {
    if (is_480p_or_lesser) sf->inter_sf.skip_newmv_in_drl = 1;

    if (is_720p_or_larger) {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_128X128;
    } else if (is_480p_or_larger) {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_64X64;
    } else {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_32X32;
    }

    if (!is_720p_or_larger) {
      sf->part_sf.ml_partition_search_breakout_thresh[0] = 200;  // BLOCK_8X8
      sf->part_sf.ml_partition_search_breakout_thresh[1] = 250;  // BLOCK_16X16
      sf->part_sf.ml_partition_search_breakout_thresh[2] = 300;  // BLOCK_32X32
      sf->part_sf.ml_partition_search_breakout_thresh[3] = 300;  // BLOCK_64X64
      sf->part_sf.ml_partition_search_breakout_thresh[4] = -1;  // BLOCK_128X128
    }
    sf->part_sf.ml_early_term_after_part_split_level = 2;

    sf->lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL1;
  }

  if (speed >= 2) {
    if (is_720p_or_larger) {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_64X64;
    } else if (is_480p_or_larger) {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_32X32;
    } else {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_32X32;
    }

    if (is_720p_or_larger) {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 24);
      sf->part_sf.partition_search_breakout_rate_thr = 120;
    } else {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 22);
      sf->part_sf.partition_search_breakout_rate_thr = 100;
    }

    if (is_720p_or_larger) {
      sf->inter_sf.prune_obmc_prob_thresh = 16;
    } else {
      sf->inter_sf.prune_obmc_prob_thresh = 8;
    }

    if (is_480p_or_larger) {
      sf->inter_sf.disable_interintra_wedge_var_thresh = 100;
    } else {
      sf->inter_sf.disable_interintra_wedge_var_thresh = UINT_MAX;
    }

    if (is_480p_or_lesser) sf->inter_sf.skip_ext_comp_nearmv_mode = 1;

    if (is_720p_or_larger) {
      sf->inter_sf.limit_inter_mode_cands = is_lf_frame ? 1 : 0;
    } else {
      sf->inter_sf.limit_inter_mode_cands = is_lf_frame ? 2 : 0;
    }

    if (is_480p_or_larger) {
      sf->tx_sf.tx_type_search.prune_tx_type_using_stats = 1;
      if (use_hbd) sf->tx_sf.prune_tx_size_level = 2;
    } else {
      if (use_hbd) sf->tx_sf.prune_tx_size_level = 3;
      sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = boosted ? 0 : 1;
      sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch = boosted ? 0 : 1;
    }

    if (!is_720p_or_larger) {
      sf->mv_sf.disable_second_mv = 1;
      sf->mv_sf.auto_mv_step_size = 2;
    } else {
      sf->mv_sf.disable_second_mv = boosted ? 0 : 2;
      sf->mv_sf.auto_mv_step_size = 1;
    }

    if (!is_720p_or_larger) {
      sf->hl_sf.recode_tolerance = 50;
      sf->inter_sf.disable_interinter_wedge_newmv_search =
          is_boosted_arf2_bwd_type ? 0 : 1;
      sf->inter_sf.enable_fast_wedge_mask_search = 1;
    }
  }

  if (speed >= 3) {
    sf->inter_sf.enable_fast_wedge_mask_search = 1;
    sf->inter_sf.skip_newmv_in_drl = 2;
    sf->inter_sf.skip_ext_comp_nearmv_mode = 1;
    sf->inter_sf.limit_inter_mode_cands = is_lf_frame ? 3 : 0;
    sf->inter_sf.disable_interinter_wedge_newmv_search = boosted ? 0 : 1;
    sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = 1;
    sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch =
        frame_is_intra_only(&cpi->common) ? 0 : 1;

    sf->part_sf.ml_early_term_after_part_split_level = 0;

    if (is_720p_or_larger) {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 25);
      sf->part_sf.partition_search_breakout_rate_thr = 200;
      sf->part_sf.skip_non_sq_part_based_on_none = is_lf_frame ? 2 : 0;
    } else {
      sf->part_sf.max_intra_bsize = BLOCK_32X32;
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 23);
      sf->part_sf.partition_search_breakout_rate_thr = 120;
      sf->part_sf.skip_non_sq_part_based_on_none = is_lf_frame ? 1 : 0;
    }
    if (use_hbd) sf->tx_sf.prune_tx_size_level = 3;

    if (is_480p_or_larger) {
      sf->part_sf.early_term_after_none_split = 1;
    } else {
      sf->part_sf.early_term_after_none_split = 0;
    }
    if (is_720p_or_larger) {
      sf->intra_sf.skip_intra_in_interframe = boosted ? 1 : 2;
    } else {
      sf->intra_sf.skip_intra_in_interframe = boosted ? 1 : 3;
    }

    if (is_720p_or_larger) {
      sf->inter_sf.disable_interinter_wedge_var_thresh = 100;
      sf->inter_sf.limit_txfm_eval_per_mode = boosted ? 0 : 1;
    } else {
      sf->inter_sf.disable_interinter_wedge_var_thresh = UINT_MAX;
      sf->inter_sf.limit_txfm_eval_per_mode = boosted ? 0 : 2;
      sf->lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL2;
    }

    sf->inter_sf.disable_interintra_wedge_var_thresh = UINT_MAX;
  }

  if (speed >= 4) {
    sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = 2;
    sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch = 1;
    if (is_720p_or_larger) {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 26);
    } else {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 24);
    }
    sf->part_sf.early_term_after_none_split = 1;

    if (is_480p_or_larger) {
      sf->tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
    } else {
      sf->mv_sf.skip_fullpel_search_using_startmv = boosted ? 0 : 1;
    }

    sf->inter_sf.disable_interinter_wedge_var_thresh = UINT_MAX;
    sf->inter_sf.prune_obmc_prob_thresh = INT_MAX;
    sf->inter_sf.limit_txfm_eval_per_mode = boosted ? 0 : 2;
    if (is_480p_or_lesser) sf->inter_sf.skip_newmv_in_drl = 3;

    if (is_720p_or_larger) {
      sf->inter_sf.prune_comp_ref_frames = 1;
    } else if (is_480p_or_larger) {
      sf->inter_sf.prune_comp_ref_frames = is_boosted_arf2_bwd_type ? 0 : 1;
    }

    if (is_720p_or_larger)
      sf->hl_sf.recode_tolerance = 32;
    else
      sf->hl_sf.recode_tolerance = 55;

    sf->intra_sf.skip_intra_in_interframe = 4;

    sf->lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL3;
  }

  if (speed >= 5) {
    if (is_720p_or_larger) {
      sf->inter_sf.prune_warped_prob_thresh = 16;
    } else if (is_480p_or_larger) {
      sf->inter_sf.prune_warped_prob_thresh = 8;
    }
    if (is_720p_or_larger) sf->hl_sf.recode_tolerance = 40;

    sf->inter_sf.skip_newmv_in_drl = 4;
    sf->inter_sf.prune_comp_ref_frames = 1;
    sf->mv_sf.skip_fullpel_search_using_startmv = boosted ? 0 : 1;

    if (!is_720p_or_larger) {
      sf->inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW_SET;
      sf->inter_sf.prune_nearest_near_mv_using_refmv_weight =
          (boosted || allow_screen_content_tools) ? 0 : 1;
      sf->mv_sf.use_downsampled_sad = 1;
    }

    if (!is_480p_or_larger) {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 26);
    }

    if (is_480p_or_lesser) {
      sf->inter_sf.prune_nearmv_using_neighbors = PRUNE_NEARMV_LEVEL1;
    } else {
      sf->inter_sf.prune_nearmv_using_neighbors = PRUNE_NEARMV_LEVEL2;
    }

    if (is_720p_or_larger)
      sf->part_sf.ext_part_eval_based_on_cur_best =
          (allow_screen_content_tools || frame_is_intra_only(cm)) ? 0 : 1;

    if (is_480p_or_larger) {
      sf->tpl_sf.reduce_num_frames = 1;
    }
  }

  if (speed >= 6) {
    sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = 4;
    sf->inter_sf.prune_nearmv_using_neighbors = PRUNE_NEARMV_LEVEL3;
    sf->inter_sf.prune_comp_ref_frames = 2;
    sf->inter_sf.prune_nearest_near_mv_using_refmv_weight =
        (boosted || allow_screen_content_tools) ? 0 : 1;
    sf->mv_sf.skip_fullpel_search_using_startmv = boosted ? 0 : 2;

    if (is_720p_or_larger) {
      sf->part_sf.auto_max_partition_based_on_simple_motion = NOT_IN_USE;
    } else if (is_480p_or_larger) {
      sf->part_sf.auto_max_partition_based_on_simple_motion = DIRECT_PRED;
    }

    if (is_480p_or_larger) {
      sf->hl_sf.allow_sub_blk_me_in_tf = 1;
    }

    if (is_1080p_or_larger) {
      sf->part_sf.default_min_partition_size = BLOCK_8X8;
    }

    if (is_720p_or_larger) {
      sf->inter_sf.disable_masked_comp = 1;
    }

    if (!is_720p_or_larger) {
      sf->inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_SBROW;
      sf->inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    }

    if (is_720p_or_larger) {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_32X32;
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 28);
    } else {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_16X16;
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 26);
    }

    if (is_720p_or_larger) {
      sf->inter_sf.prune_ref_mv_idx_search = 2;
    } else {
      sf->inter_sf.prune_ref_mv_idx_search = 1;
    }

    if (!is_720p_or_larger) {
      sf->tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh =
          is_boosted_arf2_bwd_type ? 450 : 150;
    }

    sf->lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL4;

    sf->hl_sf.recode_tolerance = 55;
  }

  if (cpi->oxcf.enable_low_complexity_decode)
    set_good_speed_features_lc_dec_framesize_dependent(cpi, sf, speed);
}